

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O0

FxExpression * __thiscall FxFlopFunctionCall::Resolve(FxFlopFunctionCall *this,FCompileContext *ctx)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  FxExpression **ppFVar5;
  undefined4 extraout_var;
  FxConstant *this_00;
  FxFloatCast *this_01;
  double dVar6;
  FxExpression *x;
  undefined1 local_40 [24];
  double v;
  FCompileContext *local_20;
  FCompileContext *ctx_local;
  FxFlopFunctionCall *this_local;
  
  this_local = this;
  if (((this->super_FxExpression).isresolved & 1U) == 0) {
    (this->super_FxExpression).isresolved = true;
    local_20 = ctx;
    ctx_local = (FCompileContext *)this;
    if ((this->ArgList == (FArgumentList *)0x0) ||
       (uVar2 = TArray<FxExpression_*,_FxExpression_*>::Size
                          (&this->ArgList->super_TArray<FxExpression_*,_FxExpression_*>), uVar2 != 1
       )) {
      FName::FName((FName *)((long)&v + 4),
                   FxFlops[*(int *)&(this->super_FxExpression).field_0x34].Name);
      pcVar4 = FName::GetChars((FName *)((long)&v + 4));
      FScriptPosition::Message
                (&(this->super_FxExpression).ScriptPosition,2,"%s only has one parameter",pcVar4);
      if (this != (FxFlopFunctionCall *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      this_local = (FxFlopFunctionCall *)0x0;
    }
    else {
      ppFVar5 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                          (&this->ArgList->super_TArray<FxExpression_*,_FxExpression_*>,0);
      iVar3 = (*(*ppFVar5)->_vptr_FxExpression[2])(*ppFVar5,local_20);
      ppFVar5 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                          (&this->ArgList->super_TArray<FxExpression_*,_FxExpression_*>,0);
      *ppFVar5 = (FxExpression *)CONCAT44(extraout_var,iVar3);
      ppFVar5 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                          (&this->ArgList->super_TArray<FxExpression_*,_FxExpression_*>,0);
      if (*ppFVar5 == (FxExpression *)0x0) {
        if (this != (FxFlopFunctionCall *)0x0) {
          (*(this->super_FxExpression)._vptr_FxExpression[1])();
        }
        this_local = (FxFlopFunctionCall *)0x0;
      }
      else {
        ppFVar5 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                            (&this->ArgList->super_TArray<FxExpression_*,_FxExpression_*>,0);
        bVar1 = FxExpression::IsNumeric(*ppFVar5);
        if (bVar1) {
          ppFVar5 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                              (&this->ArgList->super_TArray<FxExpression_*,_FxExpression_*>,0);
          uVar2 = (*(*ppFVar5)->_vptr_FxExpression[3])();
          if ((uVar2 & 1) == 0) {
            ppFVar5 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                                (&this->ArgList->super_TArray<FxExpression_*,_FxExpression_*>,0);
            iVar3 = (*((*ppFVar5)->ValueType->super_DObject)._vptr_DObject[0x12])();
            if (iVar3 == 0) {
              this_01 = (FxFloatCast *)operator_new(0x40);
              ppFVar5 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                                  (&this->ArgList->super_TArray<FxExpression_*,_FxExpression_*>,0);
              FxFloatCast::FxFloatCast(this_01,*ppFVar5);
              ppFVar5 = TArray<FxExpression_*,_FxExpression_*>::operator[]
                                  (&this->ArgList->super_TArray<FxExpression_*,_FxExpression_*>,0);
              *ppFVar5 = (FxExpression *)this_01;
            }
            (this->super_FxExpression).ValueType = (PType *)TypeFloat64;
            this_local = this;
          }
          else {
            TArray<FxExpression_*,_FxExpression_*>::operator[]
                      (&this->ArgList->super_TArray<FxExpression_*,_FxExpression_*>,0);
            FxConstant::GetValue((FxConstant *)local_40);
            dVar6 = ExpVal::GetFloat((ExpVal *)local_40);
            ExpVal::~ExpVal((ExpVal *)local_40);
            local_40._16_8_ = dVar6;
            local_40._16_8_ =
                 (*FxFlops[*(int *)&(this->super_FxExpression).field_0x34].Evaluate)(dVar6);
            this_00 = (FxConstant *)operator_new(0x48);
            FxConstant::FxConstant
                      (this_00,(double)local_40._16_8_,&(this->super_FxExpression).ScriptPosition);
            this_local = (FxFlopFunctionCall *)this_00;
            if (this != (FxFlopFunctionCall *)0x0) {
              (*(this->super_FxExpression)._vptr_FxExpression[1])();
            }
          }
        }
        else {
          FScriptPosition::Message
                    (&(this->super_FxExpression).ScriptPosition,2,
                     "numeric value expected for parameter");
          if (this != (FxFlopFunctionCall *)0x0) {
            (*(this->super_FxExpression)._vptr_FxExpression[1])();
          }
          this_local = (FxFlopFunctionCall *)0x0;
        }
      }
    }
  }
  return &this_local->super_FxExpression;
}

Assistant:

FxExpression *FxFlopFunctionCall::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();

	if (ArgList == NULL || ArgList->Size() != 1)
	{
		ScriptPosition.Message(MSG_ERROR, "%s only has one parameter", FName(FxFlops[Index].Name).GetChars());
		delete this;
		return NULL;
	}

	(*ArgList)[0] = (*ArgList)[0]->Resolve(ctx);
	if ((*ArgList)[0] == NULL)
	{
		delete this;
		return NULL;
	}

	if (!(*ArgList)[0]->IsNumeric())
	{
		ScriptPosition.Message(MSG_ERROR, "numeric value expected for parameter");
		delete this;
		return NULL;
	}
	if ((*ArgList)[0]->isConstant())
	{
		double v = static_cast<FxConstant *>((*ArgList)[0])->GetValue().GetFloat();
		v = FxFlops[Index].Evaluate(v);
		FxExpression *x = new FxConstant(v, ScriptPosition);
		delete this;
		return x;
	}
	if ((*ArgList)[0]->ValueType->GetRegType() == REGT_INT)
	{
		(*ArgList)[0] = new FxFloatCast((*ArgList)[0]);
	}
	ValueType = TypeFloat64;
	return this;
}